

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void FindHoveredWindow(void)

{
  bool bVar1;
  ImGuiWindow **ppIVar2;
  ImRect bb;
  ImGuiWindow *window;
  int i;
  ImVec2 padding_for_resize_from_edges;
  ImVec2 padding_regular;
  ImGuiWindow *hovered_window;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffffa0;
  ImGuiWindow *pIVar3;
  ImVec2 *lhs;
  ImRect local_48;
  ImGuiWindow *local_38;
  int local_2c;
  ImVec2 local_28;
  ImVec2 local_20;
  ImVec2 local_18;
  ImGuiWindow *local_10;
  ImGuiContext *local_8;
  
  local_8 = GImGui;
  local_10 = (ImGuiWindow *)0x0;
  if ((GImGui->MovingWindow != (ImGuiWindow *)0x0) && ((GImGui->MovingWindow->Flags & 0x200U) == 0))
  {
    local_10 = GImGui->MovingWindow;
  }
  local_20 = (GImGui->Style).TouchExtraPadding;
  local_18 = local_20;
  if (((GImGui->IO).ConfigWindowsResizeFromEdges & 1U) != 0) {
    lhs = &(GImGui->Style).TouchExtraPadding;
    ImVec2::ImVec2(&local_28,4.0,4.0);
    local_20 = ImMax(lhs,in_stack_ffffffffffffffa0);
  }
  local_2c = (local_8->Windows).Size;
  do {
    do {
      do {
        local_2c = local_2c + -1;
        if (local_2c < 0) goto LAB_00123108;
        ppIVar2 = ImVector<ImGuiWindow_*>::operator[](&local_8->Windows,local_2c);
        local_38 = *ppIVar2;
      } while ((((local_38->Active & 1U) == 0) || ((local_38->Hidden & 1U) != 0)) ||
              ((local_38->Flags & 0x200U) != 0));
      local_48.Min = (local_38->OuterRectClipped).Min;
      local_48.Max = (local_38->OuterRectClipped).Max;
      if (((local_38->Flags & 0x1000000U) == 0) && ((local_38->Flags & 2U) == 0)) {
        ImRect::Expand(&local_48,&local_20);
      }
      else {
        ImRect::Expand(&local_48,&local_18);
      }
      bVar1 = ImRect::Contains(&local_48,&(local_8->IO).MousePos);
    } while (!bVar1);
    if (local_10 == (ImGuiWindow *)0x0) {
      local_10 = local_38;
    }
  } while (local_10 == (ImGuiWindow *)0x0);
LAB_00123108:
  local_8->HoveredWindow = local_10;
  if (local_8->HoveredWindow == (ImGuiWindow *)0x0) {
    pIVar3 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar3 = local_8->HoveredWindow->RootWindow;
  }
  local_8->HoveredRootWindow = pIVar3;
  return;
}

Assistant:

static void FindHoveredWindow()
{
    ImGuiContext& g = *GImGui;

    ImGuiWindow* hovered_window = NULL;
    if (g.MovingWindow && !(g.MovingWindow->Flags & ImGuiWindowFlags_NoMouseInputs))
        hovered_window = g.MovingWindow;

    ImVec2 padding_regular = g.Style.TouchExtraPadding;
    ImVec2 padding_for_resize_from_edges = g.IO.ConfigWindowsResizeFromEdges ? ImMax(g.Style.TouchExtraPadding, ImVec2(WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS, WINDOWS_RESIZE_FROM_EDGES_HALF_THICKNESS)) : padding_regular;
    for (int i = g.Windows.Size - 1; i >= 0; i--)
    {
        ImGuiWindow* window = g.Windows[i];
        if (!window->Active || window->Hidden)
            continue;
        if (window->Flags & ImGuiWindowFlags_NoMouseInputs)
            continue;

        // Using the clipped AABB, a child window will typically be clipped by its parent (not always)
        ImRect bb(window->OuterRectClipped);
        if ((window->Flags & ImGuiWindowFlags_ChildWindow) || (window->Flags & ImGuiWindowFlags_NoResize))
            bb.Expand(padding_regular);
        else
            bb.Expand(padding_for_resize_from_edges);
        if (!bb.Contains(g.IO.MousePos))
            continue;

        // Those seemingly unnecessary extra tests are because the code here is a little different in viewport/docking branches.
        if (hovered_window == NULL)
            hovered_window = window;
        if (hovered_window)
            break;
    }

    g.HoveredWindow = hovered_window;
    g.HoveredRootWindow = g.HoveredWindow ? g.HoveredWindow->RootWindow : NULL;

}